

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O1

void __thiscall wasm::MergeBlocks::visitExpression(MergeBlocks *this,Expression *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  long *plVar1;
  uintptr_t uVar2;
  Expression *ast;
  Expression **ppEVar3;
  bool bVar4;
  pointer pEVar5;
  bool bVar6;
  Expression ***pppEVar7;
  int iVar8;
  uint uVar9;
  Expression **ppEVar10;
  uintptr_t uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  Expression *pEVar15;
  uint uVar16;
  ChildIterator *pCVar17;
  EffectAnalyzer *effects;
  undefined1 other [8];
  ulong uVar18;
  bool bVar19;
  undefined1 local_250 [8];
  EffectAnalyzer blockChildEffects;
  undefined1 local_c0 [8];
  ChildIterator iterator;
  undefined1 auStack_78 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> childEffects;
  Expression *local_50;
  Expression *child;
  Expression *local_40;
  Expression *back;
  
  if ((0x31 < (ulong)curr->_id) || ((0x200000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)) {
    auStack_78 = (undefined1  [8])0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_c0,curr);
    iVar8 = (int)((ulong)((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                         (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               fixed._M_elems[3]) >> 3) + local_c0._0_4_;
    if (iVar8 == 0) {
      uVar16 = 0xffffffff;
    }
    else {
      lVar13 = (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_start -
               (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                     _M_elems[3] >> 3;
      uVar12 = (long)local_c0 + lVar13;
      uVar16 = 0xffffffff;
      uVar14 = 0;
      do {
        uVar12 = uVar12 - 1;
        if ((ulong)(lVar13 + (long)local_c0) <= uVar14) goto LAB_007b9704;
        pCVar17 = (ChildIterator *)
                  (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   [3] + -4);
        if ((uVar12 & 0xfffffffc) == 0) {
          pCVar17 = &iterator;
        }
        uVar9 = (uint)uVar14;
        if ((*(pCVar17->super_AbstractChildIterator<wasm::ChildIterator>).children.fixed._M_elems
              [(uVar12 & 0xffffffff) - 1])->_id != BlockId) {
          uVar9 = uVar16;
        }
        uVar16 = uVar9;
        uVar14 = uVar14 + 1;
      } while (iVar8 != (int)uVar14);
    }
    if (uVar16 != 0xffffffff) {
      if (uVar16 != 0) {
        std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::reserve
                  ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78
                   ,(ulong)uVar16);
      }
      uVar12 = 0;
      back = (Expression *)0x0;
      do {
        uVar14 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                        _M_elems[3] >> 3) + (long)local_c0;
        if (uVar14 <= uVar12) {
LAB_007b9704:
          __assert_fail("index < children.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/iteration.h"
                        ,0x4a,
                        "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                       );
        }
        blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = ~uVar12
        ;
        uVar9 = (int)uVar14 +
                (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count;
        pppEVar7 = (Expression ***)
                   (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems[3] + ((ulong)uVar9 - 4));
        if ((uVar9 & 0xfffffffc) == 0) {
          pppEVar7 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                     _M_elems + ((ulong)uVar9 - 1);
        }
        pEVar15 = **pppEVar7;
        local_50 = pEVar15;
        if (((pEVar15->_id == BlockId) && (pEVar15[1].type.id == 0)) &&
           (uVar14 = pEVar15[2].type.id, 1 < uVar14)) {
          uVar2 = pEVar15[2].type.id;
          bVar19 = uVar2 != 0;
          if ((bVar19) && (*(long *)(**(long **)(pEVar15 + 2) + 8) != 1)) {
            uVar11 = 1;
            do {
              bVar19 = uVar2 != uVar11;
              if (uVar2 == uVar11) break;
              plVar1 = *(long **)(pEVar15 + 2) + uVar11;
              uVar11 = uVar11 + 1;
            } while (*(long *)(*plVar1 + 8) != 1);
          }
          if (bVar19) goto LAB_007b9423;
          local_40 = *(Expression **)(*(long *)(pEVar15 + 2) + (uVar14 - 1) * 8);
          if ((pEVar15->type).id == (local_40->type).id) {
            child = (Expression *)this;
            bVar4 = false;
            bVar19 = false;
            uVar18 = 0;
            iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)pEVar15;
            do {
              if (pEVar15[2].type.id <= uVar18) goto LAB_007b9723;
              ast = *(Expression **)(*(long *)(pEVar15 + 2) + uVar18 * 8);
              if (ast == local_40) {
                bVar6 = true;
              }
              else {
                EffectAnalyzer::EffectAnalyzer
                          ((EffectAnalyzer *)local_250,(PassOptions *)((child->type).id + 0x30),
                           *(Module **)(child + 0x10),ast);
                pEVar5 = childEffects.
                         super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                other = auStack_78;
                if (auStack_78 !=
                    (undefined1  [8])
                    childEffects.
                    super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  do {
                    bVar19 = bVar4;
                    bVar6 = EffectAnalyzer::invalidates
                                      ((EffectAnalyzer *)local_250,(EffectAnalyzer *)other);
                    if (bVar6) {
                      bVar19 = true;
                    }
                    other = (undefined1  [8])((long)other + 0x170);
                    bVar4 = bVar19;
                  } while (other != (undefined1  [8])pEVar5 && !bVar6);
                }
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.danglingPop);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.mutableGlobalsRead._M_t._M_impl.
                                super__Rb_tree_header._M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.features);
                pEVar15 = (Expression *)
                          iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                          flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bVar6 = bVar19;
                if (blockChildEffects.funcEffectsMap.
                    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             blockChildEffects.funcEffectsMap.
                             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  pEVar15 = (Expression *)
                            iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
              }
              this = (MergeBlocks *)child;
            } while ((!bVar6) && (uVar18 = uVar18 + 1, uVar18 != uVar14));
            if (bVar19) {
              std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
              emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                        ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                         auStack_78,(PassOptions *)((child->type).id + 0x30),
                         *(Module **)(child + 0x10),&local_50);
            }
            else {
              ppEVar3 = (Expression **)pEVar15[2].type.id;
              if (back == (Expression *)0x0) {
                if (ppEVar3 == (Expression **)0x0) {
                  __assert_fail("usedElements > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                                ,0xd5,
                                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::pop_back() [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                               );
                }
                pEVar15[2].type.id = (long)ppEVar3 - 1;
                back = pEVar15;
              }
              else if (ppEVar3 != (Expression **)0x0) {
                this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                          (back + 2);
                ppEVar10 = (Expression **)0x0;
                do {
                  if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[5] <= ppEVar10) {
LAB_007b9723:
                    __assert_fail("index < usedElements",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                                  ,0xbc,
                                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                 );
                  }
                  if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[4][(long)ppEVar10] ==
                      local_40) break;
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            (this_00,iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                     children.flexible.
                                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage[4]
                                     [(long)ppEVar10]);
                  ppEVar10 = (Expression **)((long)ppEVar10 + 1);
                } while (ppEVar3 != ppEVar10);
              }
              uVar14 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                              flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_start -
                        (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                              fixed._M_elems[3] >> 3) + (long)local_c0;
              if (uVar14 <= uVar12) goto LAB_007b9704;
              uVar9 = (int)uVar14 +
                      (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
              pppEVar7 = (Expression ***)
                         (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3] + ((ulong)uVar9 - 4));
              if ((uVar9 & 0xfffffffc) == 0) {
                pppEVar7 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                           _M_elems + ((ulong)uVar9 - 1);
              }
              **pppEVar7 = local_40;
              if (uVar12 < uVar16) {
                std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                          ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                           auStack_78,(PassOptions *)((((Expression *)this)->type).id + 0x30),
                           *(Module **)((long)this + 0x100),&local_40);
              }
            }
          }
          else {
            std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
            emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                      ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                       auStack_78,
                       &((this->
                         super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                         ).super_Pass.runner)->options,
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                       ).
                       super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .
                       super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .currModule,&local_50);
          }
        }
        else {
LAB_007b9423:
          std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
          emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                    ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)auStack_78
                     ,&((this->
                        super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                        ).super_Pass.runner)->options,
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                     ).
                     super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                     .
                     super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                     .currModule,&local_50);
        }
        pEVar15 = back;
        uVar12 = uVar12 + 1;
      } while (uVar16 + 1 != (int)uVar12);
      if (back != (Expression *)0x0) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   (back + 2),curr);
        Block::finalize((Block *)pEVar15,(Type)(curr->type).id);
        Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
        replaceCurrent(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                        ).
                        super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                        .
                        super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       ,pEVar15);
      }
    }
    if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3] !=
        (Expression **)0x0) {
      operator_delete(iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                      _M_elems[3],
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                            ._M_elems[3]);
    }
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Control flow need special handling. Those we can optimize are handled
    // below.
    if (Properties::isControlFlowStructure(curr)) {
      return;
    }

    // As we go through the children, to move things to the outside means
    // moving them past the children before them:
    //
    //  (parent
    //   (child1
    //    (A)
    //    (B)
    //   )
    //   (child2
    //
    // If we move (A) out of parent, then that is fine (further things moved
    // out would appear after it). But if we leave (B) in its current position
    // then if we try to move anything from child2 out of parent then we must
    // move those things past (B). We use a vector to track the effects of the
    // children, where it contains the effects of what was left in the child
    // after optimization.
    std::vector<EffectAnalyzer> childEffects;

    ChildIterator iterator(curr);
    auto numChildren = iterator.getNumChildren();

    // Find the last block among the children, as all we are trying to do here
    // is move the contents of blocks outwards.
    Index lastBlock = -1;
    for (Index i = 0; i < numChildren; i++) {
      if (iterator.getChild(i)->is<Block>()) {
        lastBlock = i;
      }
    }
    if (lastBlock == Index(-1)) {
      // There are no blocks at all, so there is nothing to optimize.
      return;
    }

    // We'll only compute effects up to the child before the last block, since
    // we have nothing to optimize afterwards, which sets a maximum size on the
    // vector.
    if (lastBlock > 0) {
      childEffects.reserve(lastBlock);
    }

    // The outer block that will replace us, containing the contents moved out
    // and then ourselves, assuming we manage to optimize.
    Block* outerBlock = nullptr;

    for (Index i = 0; i <= lastBlock; i++) {
      auto* child = iterator.getChild(i);
      auto* block = child->dynCast<Block>();

      auto continueEarly = [&]() {
        // When we continue early, after failing to find anything to optimize,
        // the effects we need to note for the child are simply those of the
        // child in its original form.
        childEffects.emplace_back(getPassOptions(), *getModule(), child);
      };

      // If there is no block, or it is one that might have branches, or it is
      // too small for us to remove anything from (we cannot remove the last
      // element), or if it has unreachable code (leave that for dce), then give
      // up.
      if (!block || block->name.is() || block->list.size() <= 1 ||
          hasUnreachableChild(block)) {
        continueEarly();
        continue;
      }

      // Also give up if the block's last element has a different type than the
      // block, as that would mean we would change the type received by the
      // parent (which might cause its type to need to be updated, for example).
      // Leave this alone, as other passes will simplify this anyhow (using
      // refinalize).
      auto* back = block->list.back();
      if (block->type != back->type) {
        continueEarly();
        continue;
      }

      // The block seems to have the shape we want. Check for effects: we want
      // to move all the items out but the last one, so they must all cross over
      // anything we need to move past.
      //
      // In principle we could also handle the case where we can move out only
      // some of the block items. However, that would be more complex (we'd need
      // to allocate a new block sometimes), it is rare, and it may not always
      // be helpful (we wouldn't actually be getting rid of the child block -
      // although, in the binary format such blocks tend to vanish anyhow).
      bool fail = false;
      for (auto* blockChild : block->list) {
        if (blockChild == back) {
          break;
        }
        EffectAnalyzer blockChildEffects(
          getPassOptions(), *getModule(), blockChild);
        for (auto& effects : childEffects) {
          if (blockChildEffects.invalidates(effects)) {
            fail = true;
            break;
          }
        }
        if (fail) {
          break;
        }
      }
      if (fail) {
        continueEarly();
        continue;
      }

      // Wonderful, we can do this! Move our items to an outer block, reusing
      // this one if there isn't one already.
      if (!outerBlock) {
        // Leave all the items there, just remove the last one which will remain
        // where it was.
        block->list.pop_back();
        outerBlock = block;
      } else {
        // Move the items to the existing outer block.
        for (auto* blockChild : block->list) {
          if (blockChild == back) {
            break;
          }
          outerBlock->list.push_back(blockChild);
        }
      }

      // Set the back element as the new child, replacing the block that was
      // there.
      iterator.getChild(i) = back;

      // If there are further elements, we need to know what effects the
      // remaining code has, as if they move they'll move past it.
      if (i < lastBlock) {
        childEffects.emplace_back(getPassOptions(), *getModule(), back);
      }
    }

    if (outerBlock) {
      // We moved items outside, which means we must replace ourselves with the
      // block.
      outerBlock->list.push_back(curr);
      outerBlock->finalize(curr->type);
      replaceCurrent(outerBlock);
    }
  }